

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::Grow(HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
       *this)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar2;
  size_t sVar3;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar4;
  undefined8 uVar5;
  int nProbes;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  newTable;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  local_70;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> local_50;
  aligned_storage_t<sizeof(std::pair<pbrt::LightHandle,_unsigned_long>),_alignof(std::pair<pbrt::LightHandle,_unsigned_long>)>
  local_48;
  undefined8 local_38;
  
  sVar3 = (this->table).nStored;
  local_50.memoryResource = (this->table).alloc.memoryResource;
  local_48.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  sVar8 = 0x40;
  if (0x40 < sVar3 * 2) {
    sVar8 = sVar3 * 2;
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::vector(&local_70,sVar8,
           (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)&local_48.__align,&local_50);
  if (sVar3 != 0) {
    poVar4 = (this->table).ptr;
    sVar8 = 0;
    do {
      if (poVar4[sVar8].set == true) {
        poVar1 = poVar4 + sVar8;
        uVar7 = 0;
        uVar9 = ((ulong)(poVar1->optionalValue).__align & 0xffffffffffff) * -0x395b586ca42e166b;
        uVar9 = ((uVar9 >> 0x2f ^ uVar9) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
                -0x395b586ca42e166b;
        uVar9 = (uVar9 >> 0x2f ^ uVar9) * -0x395b586ca42e166b;
        do {
          iVar6 = (int)uVar7;
          uVar10 = uVar7 >> 1;
          uVar7 = (ulong)(iVar6 + 1);
          uVar10 = (ulong)((uint)(iVar6 * iVar6) >> 1) +
                   uVar10 + ((uVar9 >> 0x2f ^ uVar9) & local_70.nStored - 1) & local_70.nStored - 1;
        } while (local_70.ptr[uVar10].set != false);
        poVar2 = local_70.ptr + uVar10;
        (poVar2->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        uVar5 = *(undefined8 *)((long)&poVar1->optionalValue + 8);
        (poVar2->optionalValue).__align = (poVar1->optionalValue).__align;
        *(undefined8 *)((long)&poVar2->optionalValue + 8) = uVar5;
        poVar2->set = true;
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != sVar3);
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::operator=(&this->table,&local_70);
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::~vector(&local_70);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }